

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_globalz_set_table_gej
               (size_t len,secp256k1_ge *r,secp256k1_fe *globalz,secp256k1_gej *a,secp256k1_fe *zr)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  secp256k1_ge *psVar6;
  long lVar7;
  secp256k1_fe *b;
  secp256k1_gej *a_00;
  secp256k1_fe zs;
  secp256k1_fe local_58;
  
  lVar7 = len - 1;
  if (len != 0) {
    psVar6 = r + lVar7;
    (psVar6->x).n[4] = a[lVar7].x.n[4];
    uVar2 = a[lVar7].x.n[0];
    uVar3 = a[lVar7].x.n[1];
    puVar1 = a[lVar7].x.n + 2;
    uVar4 = puVar1[1];
    (psVar6->x).n[2] = *puVar1;
    (psVar6->x).n[3] = uVar4;
    (psVar6->x).n[0] = uVar2;
    (psVar6->x).n[1] = uVar3;
    uVar2 = a[lVar7].y.n[1];
    puVar1 = a[lVar7].y.n + 2;
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    (psVar6->y).n[0] = a[lVar7].y.n[0];
    (psVar6->y).n[1] = uVar2;
    (psVar6->y).n[2] = uVar3;
    (psVar6->y).n[3] = uVar4;
    (psVar6->y).n[4] = a[lVar7].y.n[4];
    secp256k1_fe_normalize_weak(&psVar6->y);
    globalz->n[4] = a[lVar7].z.n[4];
    uVar2 = a[lVar7].z.n[0];
    uVar3 = a[lVar7].z.n[1];
    puVar1 = a[lVar7].z.n + 2;
    uVar4 = puVar1[1];
    globalz->n[2] = *puVar1;
    globalz->n[3] = uVar4;
    globalz->n[0] = uVar2;
    globalz->n[1] = uVar3;
    psVar6->infinity = 0;
    local_58.n[4] = zr[lVar7].n[4];
    local_58.n[0] = zr[lVar7].n[0];
    local_58.n[1] = zr[lVar7].n[1];
    local_58.n[2] = zr[lVar7].n[2];
    local_58.n[3] = (zr[lVar7].n + 2)[1];
    b = zr + len;
    a_00 = a + (len - 2);
    psVar6 = r + (len - 2);
    for (lVar5 = 0; b = b + -1, lVar7 != lVar5; lVar5 = lVar5 + 1) {
      if (lVar5 != 0) {
        secp256k1_fe_mul(&local_58,&local_58,b);
      }
      secp256k1_ge_set_gej_zinv(psVar6,a_00,&local_58);
      a_00 = a_00 + -1;
      psVar6 = psVar6 + -1;
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_globalz_set_table_gej(size_t len, secp256k1_ge *r, secp256k1_fe *globalz, const secp256k1_gej *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* The z of the final point gives us the "global Z" for the table. */
        r[i].x = a[i].x;
        r[i].y = a[i].y;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&r[i].y);
        *globalz = a[i].z;
        r[i].infinity = 0;
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &zs);
        }
    }
}